

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckDebugFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,bool isCollecting)

{
  undefined4 *puVar1;
  code *pcVar2;
  FreeObject *pFVar3;
  bool bVar4;
  BOOLEAN BVar5;
  ushort uVar6;
  BVIndex BVar7;
  undefined7 in_register_00000031;
  uint uVar8;
  undefined8 *in_FS_OFFSET;
  FreeObject *local_38;
  FreeObject *freeObject;
  
  local_38 = this->freeObjectList;
  if ((int)CONCAT71(in_register_00000031,isCollecting) == 0) {
    (*(this->super_HeapBlock)._vptr_HeapBlock[0x10])(this,&local_38);
  }
  if (local_38 == (FreeObject *)0x0) {
    uVar8 = 0;
  }
  else {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    uVar8 = 0;
    do {
      uVar6 = GetAddressIndex(this,local_38);
      if (uVar6 == 0xffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x6fb,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                           "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
        if (!bVar4) goto LAB_00208302;
        *puVar1 = 0;
      }
      pFVar3 = local_38;
      if (((ulong)local_38 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar4) goto LAB_00208302;
        *puVar1 = 0;
      }
      BVar5 = BVStatic<256UL>::Test(&this->debugFreeBits,(uint)((ulong)pFVar3 >> 4) & 0xff);
      if (BVar5 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x6fc,
                           "(this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(freeObject)))",
                           "this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(freeObject))");
        if (!bVar4) goto LAB_00208302;
        *puVar1 = 0;
      }
      uVar8 = uVar8 + 1;
      local_38 = FreeObject::GetNext(local_38);
    } while (local_38 != (FreeObject *)0x0);
  }
  BVar7 = BVStatic<256UL>::Count(&this->debugFreeBits);
  if (BVar7 != uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x700,"(this->GetDebugFreeBitVector()->Count() == verifyFreeCount)",
                       "this->GetDebugFreeBitVector()->Count() == verifyFreeCount");
    if (!bVar4) goto LAB_00208302;
    *puVar1 = 0;
  }
  if (this->lastFreeCount < uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x701,"(verifyFreeCount <= this->lastFreeCount)",
                       "verifyFreeCount <= this->lastFreeCount");
    if (!bVar4) {
LAB_00208302:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::CheckDebugFreeBitVector(bool isCollecting)
{
    FreeObject * freeObject = this->freeObjectList;

    if (!isCollecting)
    {
        this->GetFreeObjectListOnAllocator(&freeObject);
    }

    uint verifyFreeCount = 0;
    while (freeObject != nullptr)
    {
        uint index = this->GetAddressIndex(freeObject);
        Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);
        Assert(this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(freeObject)));
        verifyFreeCount++;
        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == verifyFreeCount);
    Assert(verifyFreeCount <= this->lastFreeCount);
}